

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2016.h
# Opt level: O1

void __thiscall PRED<RemSP>::PerformLabeling(PRED<RemSP> *this)

{
  long lVar1;
  char *pcVar2;
  char cVar3;
  int *piVar4;
  Mat1b *pMVar5;
  Mat1i *pMVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint *puVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  char *pcVar23;
  long lVar24;
  long lVar25;
  int iVar26;
  uint *puVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  Mat local_b8 [96];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  piVar4 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_b8,*piVar4,piVar4[1],4);
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  cv::Mat::operator=(local_b8,(Scalar_ *)&local_58);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_b8);
  cv::Mat::~Mat(local_b8);
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  puVar12 = (uint *)operator_new__((ulong)(((*(int *)&pMVar5->field_0xc -
                                            (*(int *)&pMVar5->field_0xc + 1 >> 0x1f)) + 1 >> 1) *
                                           ((*(int *)&pMVar5->field_0x8 -
                                            (*(int *)&pMVar5->field_0x8 + 1 >> 0x1f)) + 1 >> 1) + 1)
                                   << 2);
  RemSP::P_ = puVar12;
  *puVar12 = 0;
  RemSP::length_ = 1;
  iVar28 = *(int *)&pMVar5->field_0xc;
  lVar29 = (long)iVar28;
  uVar11 = *(uint *)&pMVar5->field_0x8;
  if (0 < lVar29) {
    lVar31 = *(long *)&pMVar5->field_0x10;
    lVar25 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    uVar22 = 0;
    do {
      iVar16 = (int)uVar22;
      if (*(char *)(lVar31 + iVar16) != '\0') {
        puVar12[RemSP::length_] = RemSP::length_;
        uVar10 = RemSP::length_ + 1;
        *(uint *)(lVar25 + (long)iVar16 * 4) = RemSP::length_;
        RemSP::length_ = uVar10;
        if (iVar28 <= iVar16 + 1) break;
        uVar22 = (ulong)(iVar16 + 1);
        while (*(char *)(lVar31 + uVar22) != '\0') {
          *(undefined4 *)(lVar25 + uVar22 * 4) =
               *(undefined4 *)(lVar25 + (long)((int)uVar22 + -1) * 4);
          uVar22 = uVar22 + 1;
          if (iVar28 == (int)uVar22) goto LAB_0019ba92;
        }
      }
      uVar10 = (int)uVar22 + 1;
      uVar22 = (ulong)uVar10;
    } while ((int)uVar10 < iVar28);
  }
LAB_0019ba92:
  if (1 < (int)uVar11) {
    uVar22 = 1;
    lVar31 = 0;
    do {
      pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
      pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      lVar15 = *(long *)&pMVar5->field_0x10;
      lVar7 = **(long **)&pMVar5->field_0x48;
      lVar30 = lVar7 * uVar22;
      lVar25 = lVar15 + lVar30;
      pcVar23 = (char *)(lVar25 - lVar7);
      lVar8 = *(long *)&pMVar6->field_0x10;
      lVar9 = **(long **)&pMVar6->field_0x48;
      lVar13 = lVar9 * uVar22;
      puVar12 = (uint *)(lVar8 + lVar13);
      puVar27 = (uint *)((long)puVar12 - lVar9);
      iVar28 = (int)(lVar29 + -1);
      if (iVar28 == 0) {
        if (*(char *)(lVar15 + lVar30) != '\0') {
          if (*pcVar23 == '\0') {
            RemSP::P_[RemSP::length_] = RemSP::length_;
            uVar10 = RemSP::length_ + 1;
            *puVar12 = RemSP::length_;
            RemSP::length_ = uVar10;
          }
          else {
            *puVar12 = *puVar27;
          }
        }
      }
      else {
        if (*(char *)(lVar15 + lVar30) == '\0') {
          uVar19 = 0;
          goto LAB_0019bbc4;
        }
        if (*pcVar23 == '\0') {
          if (pcVar23[1] == '\0') {
            RemSP::P_[RemSP::length_] = RemSP::length_;
            uVar10 = RemSP::length_ + 1;
            *puVar12 = RemSP::length_;
            RemSP::length_ = uVar10;
            iVar16 = 0;
            goto LAB_0019bd95;
          }
          *puVar12 = puVar27[1];
          iVar16 = 0;
          goto LAB_0019bef1;
        }
        *puVar12 = *puVar27;
        uVar19 = 0;
LAB_0019bf22:
        iVar26 = (int)uVar19;
        iVar18 = iVar26 + 1;
        iVar16 = iVar26;
        if (iVar18 < iVar28) {
          lVar24 = (long)iVar26;
          lVar14 = lVar13 + lVar24 * 4;
          lVar21 = 0;
          while( true ) {
            iVar18 = (int)(lVar24 + 1);
            if (*(char *)(lVar30 + lVar24 + lVar15 + 1 + lVar21) == '\0') {
              uVar10 = iVar18 + (int)lVar21;
              goto LAB_0019c043;
            }
            if (*(char *)(lVar7 * lVar31 + lVar24 + lVar15 + 1 + lVar21) == '\0') break;
            *(undefined4 *)(lVar8 + 4 + lVar14 + lVar21 * 4) =
                 *(undefined4 *)(lVar9 * lVar31 + lVar24 * 4 + lVar8 + 4 + lVar21 * 4);
            lVar21 = lVar21 + 1;
            if (lVar24 + (1 - lVar29) + 1 + lVar21 == 0) {
              iVar16 = iVar26 + (int)lVar21;
              iVar18 = iVar18 + (int)lVar21;
              goto LAB_0019bfe4;
            }
          }
          uVar19 = lVar24 + 1 + lVar21;
          iVar16 = (int)uVar19;
          iVar26 = iVar26 + (int)lVar21;
          iVar18 = iVar26 + 2;
          if (pcVar23[iVar18] == '\0') {
            *(uint *)(lVar14 + lVar8 + 4 + lVar21 * 4) = puVar12[iVar26];
            goto LAB_0019bd95;
          }
          uVar10 = RemSP::Merge(puVar12[iVar26],puVar27[iVar18]);
          *(uint *)(lVar14 + lVar8 + 4 + lVar21 * 4) = uVar10;
LAB_0019bee8:
          do {
            iVar16 = (int)uVar19;
LAB_0019bef1:
            lVar14 = (long)iVar16;
            uVar19 = lVar14 + 1;
            cVar3 = *(char *)(lVar25 + 1 + lVar14);
            if (iVar28 <= (int)uVar19) {
              if (cVar3 != '\0') {
                puVar12[lVar14 + 1] = puVar27[lVar14 + 1];
              }
              goto LAB_0019c0bd;
            }
            if (cVar3 != '\0') {
              puVar12[lVar14 + 1] = puVar27[lVar14 + 1];
              goto LAB_0019bf22;
            }
LAB_0019bbc4:
            while( true ) {
              lVar24 = (long)(int)uVar19;
              lVar14 = lVar24 << 0x20;
              lVar21 = 0;
              do {
                lVar17 = lVar14;
                lVar20 = lVar17 >> 0x20;
                if (lVar29 + -1 <= lVar24 + lVar21 + 1) {
                  lVar15 = lVar17 + 0x100000000 >> 0x20;
                  if (*(char *)(lVar25 + lVar15) == '\0') goto LAB_0019c0bd;
                  if (pcVar23[lVar15] == '\0') {
                    if (pcVar23[lVar20] == '\0') {
                      RemSP::P_[RemSP::length_] = RemSP::length_;
                      uVar10 = RemSP::length_ + 1;
                      puVar12[lVar15] = RemSP::length_;
                      RemSP::length_ = uVar10;
                      goto LAB_0019c0bd;
                    }
                    uVar10 = puVar27[lVar20];
                  }
                  else {
                    uVar10 = puVar27[lVar15];
                  }
                  puVar12[lVar15] = uVar10;
                  goto LAB_0019c0bd;
                }
                lVar1 = lVar21 + 1;
                pcVar2 = (char *)(lVar24 + lVar30 + lVar15 + 1 + lVar21);
                lVar14 = lVar17 + 0x100000000;
                lVar21 = lVar1;
              } while (*pcVar2 == '\0');
              uVar19 = (uVar19 & 0xffffffff) + lVar1;
              iVar16 = (int)uVar19;
              if (*(char *)(lVar1 + lVar7 * lVar31 + lVar24 + lVar15) != '\0') {
                *(undefined4 *)(lVar13 + lVar24 * 4 + lVar8 + lVar1 * 4) =
                     *(undefined4 *)(lVar9 * lVar31 + lVar24 * 4 + lVar8 + lVar1 * 4);
                goto LAB_0019bf22;
              }
              lVar14 = lVar17 + 0x200000000 >> 0x20;
              if (pcVar23[lVar14] != '\0') break;
              if (pcVar23[lVar20] == '\0') {
                RemSP::P_[RemSP::length_] = RemSP::length_;
                uVar10 = RemSP::length_ + 1;
                *(uint *)(lVar13 + lVar24 * 4 + lVar8 + lVar1 * 4) = RemSP::length_;
                RemSP::length_ = uVar10;
              }
              else {
                *(uint *)(lVar13 + lVar24 * 4 + lVar8 + lVar1 * 4) = puVar27[lVar20];
              }
LAB_0019bd95:
              iVar26 = iVar16 + 1;
              if (iVar28 <= iVar26) {
LAB_0019be57:
                lVar15 = (long)iVar26;
                if (*(char *)(lVar25 + lVar15) != '\0') goto LAB_0019c0b5;
                goto LAB_0019c0bd;
              }
              lVar21 = (long)iVar16;
              iVar26 = iVar16 + 1;
              lVar24 = lVar21 << 0x20;
              lVar14 = lVar13 + lVar21 * 4;
              lVar17 = lVar8 + lVar14;
              lVar20 = 0;
              while (*(char *)(lVar30 + lVar21 + lVar15 + 1 + lVar20) != '\0') {
                if (*(char *)(lVar7 * lVar31 + lVar21 + lVar15 + 2 + lVar20) != '\0') {
                  uVar19 = (ulong)(uint)(iVar26 + (int)lVar20);
                  uVar10 = RemSP::Merge(*(uint *)((long)puVar12 + (lVar24 >> 0x1e)),
                                        *(uint *)(lVar9 * lVar31 + lVar21 * 4 + lVar8 + 8 +
                                                 lVar20 * 4));
                  *(uint *)(lVar14 + lVar8 + 4 + lVar20 * 4) = uVar10;
                  goto LAB_0019bee8;
                }
                *(undefined4 *)(lVar17 + 4 + lVar20 * 4) = *(undefined4 *)(lVar17 + lVar20 * 4);
                lVar24 = lVar24 + 0x100000000;
                lVar20 = lVar20 + 1;
                if ((1 - lVar29) + lVar21 + 1 + lVar20 == 0) {
                  iVar16 = iVar16 + (int)lVar20;
                  iVar26 = iVar26 + (int)lVar20;
                  goto LAB_0019be57;
                }
              }
              uVar10 = iVar26 + (int)lVar20;
LAB_0019c043:
              uVar19 = (ulong)uVar10;
            }
            if (pcVar23[lVar20] == '\0') {
              uVar10 = puVar27[lVar14];
            }
            else {
              uVar10 = RemSP::Merge(puVar27[lVar20],puVar27[lVar14]);
            }
            *(uint *)(lVar13 + lVar24 * 4 + lVar8 + lVar1 * 4) = uVar10;
          } while( true );
        }
LAB_0019bfe4:
        lVar15 = (long)iVar18;
        if (*(char *)(lVar25 + lVar15) != '\0') {
          if (pcVar23[lVar15] == '\0') {
LAB_0019c0b5:
            uVar10 = puVar12[iVar16];
          }
          else {
            uVar10 = puVar27[lVar15];
          }
          puVar12[lVar15] = uVar10;
        }
      }
LAB_0019c0bd:
      uVar22 = uVar22 + 1;
      lVar31 = lVar31 + 1;
    } while (uVar22 != uVar11);
  }
  puVar12 = RemSP::P_;
  uVar11 = 1;
  if (1 < RemSP::length_) {
    uVar11 = 1;
    uVar22 = 1;
    do {
      if (puVar12[uVar22] < uVar22) {
        puVar12[uVar22] = puVar12[puVar12[uVar22]];
      }
      else {
        puVar12[uVar22] = uVar11;
        uVar11 = uVar11 + 1;
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 < RemSP::length_);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar11;
  puVar12 = RemSP::P_;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  if (0 < *(int *)&pMVar6->field_0x8) {
    lVar29 = *(long *)&pMVar6->field_0x10;
    lVar31 = **(long **)&pMVar6->field_0x48;
    lVar25 = 0;
    do {
      iVar28 = *(int *)&pMVar6->field_0xc;
      if ((long)iVar28 != 0) {
        lVar15 = 0;
        do {
          *(uint *)(lVar29 + lVar15) = puVar12[*(uint *)(lVar29 + lVar15)];
          lVar15 = lVar15 + 4;
        } while ((long)iVar28 * 4 != lVar15);
      }
      lVar25 = lVar25 + 1;
      lVar29 = lVar29 + lVar31;
    } while (lVar25 < *(int *)&pMVar6->field_0x8);
  }
  if (RemSP::P_ != (uint *)0x0) {
    operator_delete__(RemSP::P_);
  }
  return;
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0); // Call to memset

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

#define CONDITION_X img_row[c]>0
#define CONDITION_P img_row_prev[c-1]>0
#define CONDITION_Q img_row_prev[c]>0
#define CONDITION_R img_row_prev[c+1]>0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // x <- p
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // x <- r
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c - 1], img_labels_row_prev[c + 1]); // x <- p + r
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row[c - 1], img_labels_row_prev[c + 1]); // x <- s + r

#define COLS w

        {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(0);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(0);

#include "labeling_grana_2016_forest_0.inc.h"

        }

        for (int r = 1; r < h; ++r) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);

#include "labeling_grana_2016_forest.inc.h"  

        }//End rows's for

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_X
#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R

    // Second scan
        n_labels_ = LabelsSolver::Flatten();

        for (int r_i = 0; r_i < img_labels_.rows; ++r_i) {
            unsigned int *b = img_labels_.ptr<unsigned int>(r_i);
            unsigned int *e = b + img_labels_.cols;
            for (; b != e; ++b) {
                *b = LabelsSolver::GetLabel(*b);
            }
        }

        LabelsSolver::Dealloc();
    }